

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

BoxArray * __thiscall amrex::BoxArray::refine(BoxArray *this,IntVect *iv)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  uniqify(this);
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar4 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data;
  uVar5 = ((long)*(pointer *)
                  ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data + 8) - lVar4) / 0x1c;
  uVar7 = 0;
  uVar6 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 * 0x1c - uVar7 != 0; uVar7 = uVar7 + 0x1c) {
    if (((iv->vect[0] != 1) || (iv->vect[1] != 1)) || (iv->vect[2] != 1)) {
      uVar1 = *(uint *)(lVar4 + 0x18 + uVar7);
      *(int *)(lVar4 + uVar7) = iv->vect[0] * *(int *)(lVar4 + uVar7);
      *(int *)(lVar4 + 4 + uVar7) = *(int *)(lVar4 + 4 + uVar7) * iv->vect[1];
      *(int *)(lVar4 + 8 + uVar7) = *(int *)(lVar4 + 8 + uVar7) * iv->vect[2];
      iVar10 = *(int *)(lVar4 + 0xc + uVar7) + (~uVar1 & 1);
      *(int *)(lVar4 + 0xc + uVar7) = iVar10;
      uVar8 = (uint)((uVar1 & 2) == 0);
      iVar11 = *(int *)(lVar4 + 0x10 + uVar7) + uVar8;
      *(int *)(lVar4 + 0x10 + uVar7) = iVar11;
      uVar9 = (uint)((uVar1 & 4) == 0);
      iVar12 = *(int *)(lVar4 + 0x14 + uVar7) + uVar9;
      *(int *)(lVar4 + 0x14 + uVar7) = iVar12;
      iVar10 = iVar10 * iv->vect[0];
      *(int *)(lVar4 + 0xc + uVar7) = iVar10;
      iVar11 = iVar11 * iv->vect[1];
      *(int *)(lVar4 + 0x10 + uVar7) = iVar11;
      iVar2 = iv->vect[2];
      *(uint *)(lVar4 + 0xc + uVar7) = iVar10 - (~uVar1 & 1);
      *(uint *)(lVar4 + 0x10 + uVar7) = iVar11 - uVar8;
      *(uint *)(lVar4 + 0x14 + uVar7) = iVar12 * iVar2 - uVar9;
    }
  }
  return this;
}

Assistant:

BoxArray&
BoxArray::refine (const IntVect& iv)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        BL_ASSERT(m_ref->m_abox[i].ok());
        m_ref->m_abox[i].refine(iv);
    }
    return *this;
}